

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::GridRenderCase::verifyRenderResult
          (GridRenderCase *this,IterationConfig *config)

{
  code *pcVar1;
  RGBA RVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  deUint32 dVar6;
  int y_00;
  RenderContext *pRVar7;
  float extraout_var;
  TestLog *pTVar8;
  MessageBuilder *pMVar9;
  ObjectWrapper *this_00;
  bool local_d39;
  bool local_d15;
  ConstPixelBufferAccess local_b80;
  allocator<char> local_b51;
  string local_b50;
  allocator<char> local_b29;
  string local_b28;
  LogImage local_b08;
  allocator<char> local_a71;
  string local_a70;
  allocator<char> local_a49;
  string local_a48;
  LogImageSet local_a28;
  MessageBuilder local_9e8;
  ConstPixelBufferAccess local_868;
  allocator<char> local_839;
  string local_838;
  allocator<char> local_811;
  string local_810;
  LogImage local_7f0;
  ConstPixelBufferAccess local_760;
  allocator<char> local_731;
  string local_730;
  allocator<char> local_709;
  string local_708;
  LogImage local_6e8;
  allocator<char> local_651;
  string local_650;
  allocator<char> local_629;
  string local_628;
  LogImageSet local_608;
  MessageBuilder local_5c8;
  deUint32 local_444;
  byte local_43f;
  bool local_43e;
  bool local_43d;
  RGBA local_43c;
  bool error;
  bool insideGrid;
  int iStack_438;
  bool outsideGrid;
  RGBA pixel;
  int x;
  int y;
  PixelBufferAccess local_420;
  PixelBufferAccess local_3f8;
  MessageBuilder local_3d0;
  int local_250;
  int local_24c;
  int local_248;
  int local_244;
  float local_240;
  float local_23c;
  float local_238;
  float local_234;
  float local_230;
  float local_22c;
  MessageBuilder local_228;
  byte local_a5;
  bool anyError;
  undefined1 local_98 [8];
  Surface errorMask;
  Surface viewportSurface;
  IVec4 viewportGridInnerArea;
  IVec4 viewportGridOuterArea;
  IVec4 viewportBBoxArea;
  ProjectedBBox projectedBBox;
  Functions *gl;
  IterationConfig *config_local;
  GridRenderCase_conflict *this_local;
  
  pRVar7 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  projectedBBox.max.m_data[1] = (float)(*pRVar7->_vptr_RenderContext[3])();
  projectedBBox.max.m_data[2] = extraout_var;
  projectBoundingBox((ProjectedBBox *)(viewportBBoxArea.m_data + 2),&config->bbox);
  getViewportBoundingBoxArea
            ((anon_unknown_1 *)(viewportGridOuterArea.m_data + 2),
             (ProjectedBBox *)(viewportBBoxArea.m_data + 2),&config->viewportSize,0.0);
  BBoxRenderCase::getViewportPatternArea
            ((BBoxRenderCase *)(viewportGridInnerArea.m_data + 2),(Vec2 *)this,&config->patternPos,
             (IVec2 *)&config->patternSize,(int)config + 8);
  BBoxRenderCase::getViewportPatternArea
            ((BBoxRenderCase *)&viewportSurface.m_pixels.m_cap,(Vec2 *)this,&config->patternPos,
             (IVec2 *)&config->patternSize,(int)config + 8);
  iVar4 = tcu::Vector<int,_2>::x(&config->viewportSize);
  iVar5 = tcu::Vector<int,_2>::y(&config->viewportSize);
  tcu::Surface::Surface((Surface *)&errorMask.m_pixels.m_cap,iVar4,iVar5);
  iVar4 = tcu::Vector<int,_2>::x(&config->viewportSize);
  iVar5 = tcu::Vector<int,_2>::y(&config->viewportSize);
  tcu::Surface::Surface((Surface *)local_98,iVar4,iVar5);
  local_a5 = 0;
  if (((ulong)this->m_program & 0x1000000) == 0) {
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_228,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (&local_228,(char (*) [38])"Projected bounding box: (clip space)\n");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [6])"\tx: [");
    local_22c = tcu::Vector<float,_3>::x((Vector<float,_3> *)(viewportBBoxArea.m_data + 2));
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_22c);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x2c6b075);
    local_230 = tcu::Vector<float,_3>::x((Vector<float,_3> *)(projectedBBox.min.m_data + 1));
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_230);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2b3d307);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [6])"\ty: [");
    local_234 = tcu::Vector<float,_3>::y((Vector<float,_3> *)(viewportBBoxArea.m_data + 2));
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_234);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x2c6b075);
    local_238 = tcu::Vector<float,_3>::y((Vector<float,_3> *)(projectedBBox.min.m_data + 1));
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_238);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2b3d307);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [6])"\tz: [");
    local_23c = tcu::Vector<float,_3>::z((Vector<float,_3> *)(viewportBBoxArea.m_data + 2));
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_23c);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x2c6b075);
    local_240 = tcu::Vector<float,_3>::z((Vector<float,_3> *)(projectedBBox.min.m_data + 1));
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_240);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2b3d307);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [26])"In viewport coordinates:\n");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [6])"\tx: [");
    local_244 = tcu::Vector<int,_4>::x((Vector<int,_4> *)(viewportGridOuterArea.m_data + 2));
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_244);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2a4b1eb);
    local_248 = tcu::Vector<int,_4>::z((Vector<int,_4> *)(viewportGridOuterArea.m_data + 2));
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_248);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2b3d307);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [6])"\ty: [");
    local_24c = tcu::Vector<int,_4>::y((Vector<int,_4> *)(viewportGridOuterArea.m_data + 2));
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_24c);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2a4b1eb);
    local_250 = tcu::Vector<int,_4>::w((Vector<int,_4> *)(viewportGridOuterArea.m_data + 2));
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_250);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2b3d307);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (pMVar9,(char (*) [51])"Verifying render results within the bounding box.\n")
    ;
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_228);
  }
  else {
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_3d0,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<(&local_3d0,(char (*) [25])"Verifying render result.");
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_3d0);
  }
  bVar3 = de::details::UniqueBase::operator_cast_to_bool
                    ((UniqueBase *)
                     &this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length);
  if (bVar3) {
    pcVar1 = *(code **)(projectedBBox.max.m_data._4_8_ + 0x78);
    this_00 = &de::details::
               UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
               ::operator*((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                            *)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name.
                               _M_string_length)->super_ObjectWrapper;
    dVar6 = glu::ObjectWrapper::operator*(this_00);
    (*pcVar1)(0x8ca8,dVar6);
  }
  pRVar7 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = tcu::Vector<int,_2>::x(&config->viewportPos);
  iVar5 = tcu::Vector<int,_2>::y(&config->viewportPos);
  tcu::Surface::getAccess(&local_3f8,(Surface *)&errorMask.m_pixels.m_cap);
  glu::readPixels(pRVar7,iVar4,iVar5,&local_3f8);
  tcu::Surface::getAccess(&local_420,(Surface *)local_98);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&x,0,0,0,0xff);
  tcu::clear(&local_420,(IVec4 *)&x);
  iVar4 = tcu::Vector<int,_4>::y((Vector<int,_4> *)(viewportGridOuterArea.m_data + 2));
  pixel.m_value = de::max<int>(iVar4,0);
  while( true ) {
    RVar2.m_value = pixel.m_value;
    iVar4 = tcu::Vector<int,_4>::w((Vector<int,_4> *)(viewportGridOuterArea.m_data + 2));
    iVar5 = tcu::Vector<int,_2>::y(&config->viewportSize);
    iVar4 = de::min<int>(iVar4,iVar5);
    if (iVar4 <= (int)RVar2.m_value) break;
    iVar4 = tcu::Vector<int,_4>::x((Vector<int,_4> *)(viewportGridOuterArea.m_data + 2));
    iStack_438 = de::max<int>(iVar4,0);
    while( true ) {
      iVar4 = iStack_438;
      iVar5 = tcu::Vector<int,_4>::z((Vector<int,_4> *)(viewportGridOuterArea.m_data + 2));
      y_00 = tcu::Vector<int,_2>::x(&config->viewportSize);
      iVar5 = de::min<int>(iVar5,y_00);
      if (iVar5 <= iVar4) break;
      local_43c = tcu::Surface::getPixel
                            ((Surface *)&errorMask.m_pixels.m_cap,iStack_438,pixel.m_value);
      iVar4 = iStack_438;
      iVar5 = tcu::Vector<int,_4>::x((Vector<int,_4> *)(viewportGridInnerArea.m_data + 2));
      RVar2 = pixel;
      local_d15 = true;
      if (iVar5 <= iVar4) {
        iVar5 = tcu::Vector<int,_4>::y((Vector<int,_4> *)(viewportGridInnerArea.m_data + 2));
        iVar4 = iStack_438;
        local_d15 = true;
        if (iVar5 <= (int)RVar2.m_value) {
          iVar5 = tcu::Vector<int,_4>::z((Vector<int,_4> *)(viewportGridInnerArea.m_data + 2));
          RVar2 = pixel;
          local_d15 = true;
          if (iVar4 <= iVar5) {
            iVar4 = tcu::Vector<int,_4>::w((Vector<int,_4> *)(viewportGridInnerArea.m_data + 2));
            local_d15 = iVar4 < (int)RVar2.m_value;
          }
        }
      }
      iVar4 = iStack_438;
      local_43d = local_d15;
      iVar5 = tcu::Vector<int,_4>::x((Vector<int,_4> *)&viewportSurface.m_pixels.m_cap);
      RVar2 = pixel;
      local_d39 = false;
      if (iVar5 < iVar4) {
        iVar5 = tcu::Vector<int,_4>::y((Vector<int,_4> *)&viewportSurface.m_pixels.m_cap);
        iVar4 = iStack_438;
        local_d39 = false;
        if (iVar5 < (int)RVar2.m_value) {
          iVar5 = tcu::Vector<int,_4>::z((Vector<int,_4> *)&viewportSurface.m_pixels.m_cap);
          RVar2 = pixel;
          local_d39 = false;
          if (iVar4 < iVar5) {
            iVar4 = tcu::Vector<int,_4>::w((Vector<int,_4> *)&viewportSurface.m_pixels.m_cap);
            local_d39 = (int)RVar2.m_value < iVar4;
          }
        }
      }
      local_43e = local_d39;
      local_43f = 0;
      if ((local_43d & 1U) == 0) {
        if ((local_d39 != false) &&
           ((iVar4 = tcu::RGBA::getGreen(&local_43c), iVar4 != 0xff ||
            (iVar4 = tcu::RGBA::getBlue(&local_43c), iVar4 != 0)))) {
          local_43f = 1;
        }
      }
      else {
        iVar4 = tcu::RGBA::getRed(&local_43c);
        if (((iVar4 != 0) || (iVar4 = tcu::RGBA::getGreen(&local_43c), iVar4 != 0)) ||
           (iVar4 = tcu::RGBA::getBlue(&local_43c), iVar4 != 0)) {
          local_43f = 1;
        }
      }
      RVar2.m_value = pixel.m_value;
      iVar4 = iStack_438;
      if ((local_43f & 1) != 0) {
        local_444 = (deUint32)tcu::RGBA::red();
        tcu::Surface::setPixel((Surface *)local_98,iVar4,RVar2.m_value,(RGBA)local_444);
        local_a5 = 1;
      }
      iStack_438 = iStack_438 + 1;
    }
    pixel.m_value = pixel.m_value + 1;
  }
  if ((local_a5 & 1) == 0) {
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_9e8,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<(&local_9e8,(char (*) [17])"Result image ok.");
    pTVar8 = tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a48,"Images",&local_a49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a70,"Image verification",&local_a71);
    tcu::LogImageSet::LogImageSet(&local_a28,&local_a48,&local_a70);
    pTVar8 = tcu::TestLog::operator<<(pTVar8,&local_a28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b28,"Viewport",&local_b29);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b50,"Viewport contents",&local_b51);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_b80,(Surface *)&errorMask.m_pixels.m_cap);
    tcu::LogImage::LogImage
              (&local_b08,&local_b28,&local_b50,&local_b80,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar8 = tcu::TestLog::operator<<(pTVar8,&local_b08);
    tcu::TestLog::operator<<(pTVar8,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
    tcu::LogImage::~LogImage(&local_b08);
    std::__cxx11::string::~string((string *)&local_b50);
    std::allocator<char>::~allocator(&local_b51);
    std::__cxx11::string::~string((string *)&local_b28);
    std::allocator<char>::~allocator(&local_b29);
    tcu::LogImageSet::~LogImageSet(&local_a28);
    std::__cxx11::string::~string((string *)&local_a70);
    std::allocator<char>::~allocator(&local_a71);
    std::__cxx11::string::~string((string *)&local_a48);
    std::allocator<char>::~allocator(&local_a49);
    tcu::MessageBuilder::~MessageBuilder(&local_9e8);
  }
  else {
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_5c8,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<(&local_5c8,(char (*) [27])"Image verification failed.")
    ;
    pTVar8 = tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_628,"Images",&local_629);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_650,"Image verification",&local_651);
    tcu::LogImageSet::LogImageSet(&local_608,&local_628,&local_650);
    pTVar8 = tcu::TestLog::operator<<(pTVar8,&local_608);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_708,"Viewport",&local_709);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_730,"Viewport contents",&local_731);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_760,(Surface *)&errorMask.m_pixels.m_cap);
    tcu::LogImage::LogImage
              (&local_6e8,&local_708,&local_730,&local_760,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar8 = tcu::TestLog::operator<<(pTVar8,&local_6e8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_810,"ErrorMask",&local_811);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_838,"Error mask",&local_839)
    ;
    tcu::Surface::getAccess((PixelBufferAccess *)&local_868,(Surface *)local_98);
    tcu::LogImage::LogImage
              (&local_7f0,&local_810,&local_838,&local_868,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar8 = tcu::TestLog::operator<<(pTVar8,&local_7f0);
    tcu::TestLog::operator<<(pTVar8,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
    tcu::LogImage::~LogImage(&local_7f0);
    std::__cxx11::string::~string((string *)&local_838);
    std::allocator<char>::~allocator(&local_839);
    std::__cxx11::string::~string((string *)&local_810);
    std::allocator<char>::~allocator(&local_811);
    tcu::LogImage::~LogImage(&local_6e8);
    std::__cxx11::string::~string((string *)&local_730);
    std::allocator<char>::~allocator(&local_731);
    std::__cxx11::string::~string((string *)&local_708);
    std::allocator<char>::~allocator(&local_709);
    tcu::LogImageSet::~LogImageSet(&local_608);
    std::__cxx11::string::~string((string *)&local_650);
    std::allocator<char>::~allocator(&local_651);
    std::__cxx11::string::~string((string *)&local_628);
    std::allocator<char>::~allocator(&local_629);
    tcu::MessageBuilder::~MessageBuilder(&local_5c8);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image verification failed");
  }
  tcu::Surface::~Surface((Surface *)local_98);
  tcu::Surface::~Surface((Surface *)&errorMask.m_pixels.m_cap);
  return;
}

Assistant:

void GridRenderCase::verifyRenderResult (const IterationConfig& config)
{
	const glw::Functions&	gl						= m_context.getRenderContext().getFunctions();
	const ProjectedBBox		projectedBBox			= projectBoundingBox(config.bbox);
	const tcu::IVec4		viewportBBoxArea		= getViewportBoundingBoxArea(projectedBBox, config.viewportSize);
	const tcu::IVec4		viewportGridOuterArea	= getViewportPatternArea(config.patternPos, config.patternSize, config.viewportSize, ROUND_OUTWARDS);
	const tcu::IVec4		viewportGridInnerArea	= getViewportPatternArea(config.patternPos, config.patternSize, config.viewportSize, ROUND_INWARDS);
	tcu::Surface			viewportSurface			(config.viewportSize.x(), config.viewportSize.y());
	tcu::Surface			errorMask				(config.viewportSize.x(), config.viewportSize.y());
	bool					anyError				= false;

	if (!m_calcPerPrimitiveBBox)
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Projected bounding box: (clip space)\n"
				<< "\tx: [" << projectedBBox.min.x() << "," << projectedBBox.max.x() << "]\n"
				<< "\ty: [" << projectedBBox.min.y() << "," << projectedBBox.max.y() << "]\n"
				<< "\tz: [" << projectedBBox.min.z() << "," << projectedBBox.max.z() << "]\n"
			<< "In viewport coordinates:\n"
				<< "\tx: [" << viewportBBoxArea.x() << ", " << viewportBBoxArea.z() << "]\n"
				<< "\ty: [" << viewportBBoxArea.y() << ", " << viewportBBoxArea.w() << "]\n"
			<< "Verifying render results within the bounding box.\n"
			<< tcu::TestLog::EndMessage;
	else
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Verifying render result."
			<< tcu::TestLog::EndMessage;

	if (m_fbo)
		gl.bindFramebuffer(GL_READ_FRAMEBUFFER, **m_fbo);
	glu::readPixels(m_context.getRenderContext(), config.viewportPos.x(), config.viewportPos.y(), viewportSurface.getAccess());

	tcu::clear(errorMask.getAccess(), tcu::IVec4(0,0,0,255));

	for (int y = de::max(viewportBBoxArea.y(), 0); y < de::min(viewportBBoxArea.w(), config.viewportSize.y()); ++y)
	for (int x = de::max(viewportBBoxArea.x(), 0); x < de::min(viewportBBoxArea.z(), config.viewportSize.x()); ++x)
	{
		const tcu::RGBA	pixel		= viewportSurface.getPixel(x, y);
		const bool		outsideGrid	= x < viewportGridOuterArea.x() ||
									  y < viewportGridOuterArea.y() ||
									  x > viewportGridOuterArea.z() ||
									  y > viewportGridOuterArea.w();
		const bool		insideGrid	= x > viewportGridInnerArea.x() &&
									  y > viewportGridInnerArea.y() &&
									  x < viewportGridInnerArea.z() &&
									  y < viewportGridInnerArea.w();

		bool			error		= false;

		if (outsideGrid)
		{
			// expect black
			if (pixel.getRed() != 0 || pixel.getGreen() != 0 || pixel.getBlue() != 0)
				error = true;
		}

		else if (insideGrid)
		{
			// expect green, yellow or a combination of these
			if (pixel.getGreen() != 255 || pixel.getBlue() != 0)
				error = true;
		}
		else
		{
			// boundary, allow anything
		}

		if (error)
		{
			errorMask.setPixel(x, y, tcu::RGBA::red());
			anyError = true;
		}
	}

	if (anyError)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Image verification failed."
			<< tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Images", "Image verification")
			<< tcu::TestLog::Image("Viewport", "Viewport contents", viewportSurface.getAccess())
			<< tcu::TestLog::Image("ErrorMask", "Error mask", errorMask.getAccess())
			<< tcu::TestLog::EndImageSet;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
	}
	else
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Result image ok."
			<< tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Images", "Image verification")
			<< tcu::TestLog::Image("Viewport", "Viewport contents", viewportSurface.getAccess())
			<< tcu::TestLog::EndImageSet;
	}
}